

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.hpp
# Opt level: O2

void ruckig::Block::remove_profile<6ul>
               (array<ruckig::Profile,_6UL> *valid_profiles,size_t *valid_profile_counter,
               size_t index)

{
  Profile *__dest;
  
  __dest = valid_profiles->_M_elems + index;
  for (; index < *valid_profile_counter - 1; index = index + 1) {
    memcpy(__dest,__dest + 1,0x23c);
    __dest = __dest + 1;
  }
  *valid_profile_counter = *valid_profile_counter - 1;
  return;
}

Assistant:

inline static void remove_profile(std::array<Profile, N>& valid_profiles, size_t& valid_profile_counter, size_t index) {
        for (size_t i = index; i < valid_profile_counter - 1; ++i) {
            valid_profiles[i] = valid_profiles[i + 1];
        }
        valid_profile_counter -= 1;
    }